

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_helper.cpp
# Opt level: O0

string * duckdb::KeywordHelper::WriteQuoted(string *text,char quote)

{
  char in_DL;
  string *in_RDI;
  allocator local_b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  string local_90 [55];
  allocator local_59;
  string local_58 [31];
  char in_stack_ffffffffffffffc7;
  string *in_stack_ffffffffffffffc8;
  
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_58,1,in_DL,&local_59);
  EscapeQuotes(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc7);
  ::std::operator+(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&stack0xffffffffffffff50,1,in_DL,&local_b1);
  ::std::operator+(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  ::std::__cxx11::string::~string(local_90);
  ::std::__cxx11::string::~string(local_58);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_59);
  return in_RDI;
}

Assistant:

string KeywordHelper::WriteQuoted(const string &text, char quote) {
	// 1. Escapes all occurences of 'quote' by doubling them (escape in SQL)
	// 2. Adds quotes around the string
	return string(1, quote) + EscapeQuotes(text, quote) + string(1, quote);
}